

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stb.h
# Opt level: O1

stbfile * stb_open_outbuffer(uchar **update_on_close)

{
  stbfile *psVar1;
  long lVar2;
  undefined **ppuVar3;
  stbfile *psVar4;
  byte bVar5;
  
  bVar5 = 0;
  psVar1 = (stbfile *)malloc(0x68);
  if (psVar1 != (stbfile *)0x0) {
    (psVar1->field_12).ptr = update_on_close;
    ppuVar3 = &PTR_stb__nogetbyte_001f4d00;
    psVar4 = psVar1;
    for (lVar2 = 0xd; lVar2 != 0; lVar2 = lVar2 + -1) {
      psVar4->getbyte = (_func_int_stbfile_ptr *)*ppuVar3;
      ppuVar3 = ppuVar3 + (ulong)bVar5 * -2 + 1;
      psVar4 = (stbfile *)((long)psVar4 + (ulong)bVar5 * -0x10 + 8);
    }
  }
  return psVar1;
}

Assistant:

stbfile *stb_open_outbuffer(unsigned char **update_on_close)
{
   stbfile m = { stb__nogetbyte, stb__nogetdata,
                 stb__aputbyte, stb__aputdata,
                 stb__asize, stb__asize, stb__abackpatch, stb__aclose };
   stbfile *z = (stbfile *) malloc(sizeof(*z));
   if (z) {
      z->ptr = update_on_close;
      *z = m;
   }
   return z;
}